

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

void assert_solvers_result<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
               (matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>
                *cost_matrix,duration<long,_boost::ratio<1L,_1L>_> expected_cost,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *expected_assignment,
               less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_> *cost_comparator)

{
  _func_duration<long,_boost::ratio<1L,_1L>_>_matrix<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>,_std::allocator<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_>_>_ptr_unsigned_long_unsigned_long_vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr_less<boost::chrono::duration<long,_boost::ratio<1L,_1L>_>_>_ptr
  *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Testing Hungarian solver",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  local_38 = hungarian_algorithm::
             solve<boost::chrono::duration<long,boost::ratio<1l,1l>>,unsigned_long,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
  ;
  assert_solver_result<boost::chrono::duration<long,boost::ratio<1l,1l>>(*)(boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>const&),boost::chrono::duration<long,boost::ratio<1l,1l>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
            (&local_38,cost_matrix,expected_cost,expected_assignment,cost_comparator);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"  Testing brute force solver",0x1c);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  local_38 = hungarian_algorithm::
             solveBruteForce<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
  ;
  assert_solver_result<boost::chrono::duration<long,boost::ratio<1l,1l>>(*)(boost::numeric::ublas::matrix<boost::chrono::duration<long,boost::ratio<1l,1l>>,boost::numeric::ublas::basic_row_major<unsigned_long,long>,boost::numeric::ublas::unbounded_array<boost::chrono::duration<long,boost::ratio<1l,1l>>,std::allocator<boost::chrono::duration<long,boost::ratio<1l,1l>>>>>const&,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>const&),boost::chrono::duration<long,boost::ratio<1l,1l>>,std::less<boost::chrono::duration<long,boost::ratio<1l,1l>>>>
            (&local_38,cost_matrix,expected_cost,expected_assignment,cost_comparator);
  return;
}

Assistant:

void assert_solvers_result(const ublas::matrix<Cost>& cost_matrix, const Cost expected_cost,
                           const std::vector<std::size_t>& expected_assignment,
                           const CostComparator& cost_comparator)
{
  typedef Cost SolvingFunction(const ublas::matrix<Cost>&, const std::size_t, const std::size_t,
                               std::vector<std::size_t>&, const CostComparator&);
  std::cout << "  Testing Hungarian solver" << std::endl;
  assert_solver_result(static_cast<SolvingFunction*>(&hungarian_algorithm::solve), cost_matrix, expected_cost,
                       expected_assignment, cost_comparator);
  std::cout << "  Testing brute force solver" << std::endl;
  assert_solver_result(static_cast<SolvingFunction*>(&hungarian_algorithm::solveBruteForce), cost_matrix, expected_cost,
                       expected_assignment, cost_comparator);
}